

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.c
# Opt level: O2

int nn_literal_resolve(char *addr,size_t addrlen,int ipv4only,sockaddr_storage *result,
                      size_t *resultlen)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  char *pcVar4;
  FILE *__stream;
  undefined8 uVar5;
  size_t sStack_80;
  in_addr inaddr;
  in6_addr in6addr;
  char addrz [46];
  
  if (addrlen != 0) {
    if (*addr == '[') {
      if (addrlen - 0x30 < 0xffffffffffffffd1) {
        return -0x16;
      }
      if (addr[addrlen - 1] != ']') {
        return -0x16;
      }
      addrlen = addrlen - 2;
      addr = addr + 1;
    }
    else if (addrlen - 0x2e < 0xffffffffffffffd1) {
      return -0x16;
    }
  }
  memcpy(addrz,addr,addrlen);
  addrz[addrlen] = '\0';
  if (ipv4only == 0) {
    iVar2 = inet_pton(10,addrz,&in6addr);
    __stream = _stderr;
    if (iVar2 == 1) {
      if (result != (sockaddr_storage *)0x0) {
        result->ss_family = 10;
        *(undefined8 *)(result->__ss_padding + 6) = in6addr.__in6_u._0_8_;
        *(undefined8 *)(result->__ss_padding + 0xe) = in6addr.__in6_u._8_8_;
      }
      if (resultlen == (size_t *)0x0) {
        return 0;
      }
      sStack_80 = 0x1c;
      goto LAB_0011eb71;
    }
    if (iVar2 != 0) {
      puVar3 = (uint *)__errno_location();
      pcVar4 = nn_err_strerror(*puVar3);
      uVar1 = *puVar3;
      uVar5 = 0x72;
      goto LAB_0011ebf8;
    }
  }
  iVar2 = inet_pton(2,addrz,&inaddr);
  __stream = _stderr;
  if (iVar2 != 1) {
    if (iVar2 == 0) {
      return -0x16;
    }
    puVar3 = (uint *)__errno_location();
    pcVar4 = nn_err_strerror(*puVar3);
    uVar1 = *puVar3;
    uVar5 = 0x80;
LAB_0011ebf8:
    fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar4,(ulong)uVar1,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/utils/literal.c"
            ,uVar5);
    fflush(_stderr);
    nn_err_abort();
  }
  if (result != (sockaddr_storage *)0x0) {
    result->ss_family = 2;
    *(in_addr_t *)(result->__ss_padding + 2) = inaddr.s_addr;
  }
  if (resultlen == (size_t *)0x0) {
    return 0;
  }
  sStack_80 = 0x10;
LAB_0011eb71:
  *resultlen = sStack_80;
  return 0;
}

Assistant:

int nn_literal_resolve (const char *addr, size_t addrlen,
    int ipv4only, struct sockaddr_storage *result, size_t *resultlen)
{
    int rc;
    char addrz [INET6_ADDRSTRLEN > INET_ADDRSTRLEN ?
        INET6_ADDRSTRLEN :  INET_ADDRSTRLEN];
    struct in_addr inaddr;
    struct in6_addr in6addr;

    /*  Try to treat the address as a literal string. If the size of
        the address is larger than longest possible literal, skip the step.
        If the literal in enclosed in square brackets ignore them. */
    if (addrlen > 0 && addr [0] == '[') {
        if (addr [addrlen - 1] != ']')
            return -EINVAL;
        if (addrlen - 2 + 1 > sizeof (addrz))
            return -EINVAL;
        memcpy (addrz, addr + 1, addrlen - 2);
        addrz [addrlen - 2] = 0;
    }
    else {
        if (addrlen + 1 > sizeof (addrz))
            return -EINVAL;
        memcpy (addrz, addr, addrlen);
        addrz [addrlen] = 0;
    }

    /*  Try to interpret the literal as an IPv6 address. */
    if (!ipv4only) {
        rc = nn_inet_pton (AF_INET6, addrz, &in6addr);
        if (rc == 1) {
            if (result) {
                result->ss_family = AF_INET6;
                ((struct sockaddr_in6*) result)->sin6_addr = in6addr;
             }
             if (resultlen)
                *resultlen = sizeof (struct sockaddr_in6);
            return 0;
        }
        errno_assert (rc == 0);
    }

    /*  Try to interpret the literal as an IPv4 address. */
    rc = nn_inet_pton (AF_INET, addrz, &inaddr);
    if (rc == 1) {
        if (result) {
           result->ss_family = AF_INET;
           ((struct sockaddr_in*) result)->sin_addr = inaddr;
        }
        if (resultlen)
            *resultlen = sizeof (struct sockaddr_in);
        return 0;
    }
    errno_assert (rc == 0);

    /*  The supplied string is not a valid literal address. */
    return -EINVAL;
}